

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::on_replacement_field
          (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
           *this,char *p)

{
  size_t *psVar1;
  char *pcVar2;
  iterator iVar3;
  arg_formatter<fmt::v6::buffer_range<char>_> local_30;
  
  pcVar2 = (this->parse_context).format_str_.data_;
  (this->parse_context).format_str_.data_ = p;
  psVar1 = &(this->parse_context).format_str_.size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)p));
  local_30.parse_ctx_ = &this->parse_context;
  local_30.ctx_ = &this->context;
  local_30.super_arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>.
  writer_.out_.container = (this->context).out_.container;
  local_30.super_arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>.
  writer_.locale_.locale_ = (this->context).loc_.locale_;
  local_30.super_arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>.
  specs_ = (format_specs *)0x0;
  iVar3 = visit_format_arg<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                    (&local_30,&this->arg);
  (this->context).out_.container = iVar3.container;
  return;
}

Assistant:

void on_replacement_field(const Char* p) {
    advance_to(parse_context, p);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context), arg));
  }